

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O2

GlobalVariable * LLVMBC::dyn_cast<LLVMBC::GlobalVariable>(Value *value)

{
  ValueKind VVar1;
  GlobalVariable *this;
  GlobalVariable *pGVar2;
  
  if (value != (Value *)0x0) {
    this = (GlobalVariable *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)this);
    pGVar2 = (GlobalVariable *)0x0;
    if (VVar1 == Global) {
      pGVar2 = this;
    }
    return pGVar2;
  }
  return (GlobalVariable *)0x0;
}

Assistant:

inline T *dyn_cast(Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<T *>(value);
	else
		return nullptr;
}